

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuStringTemplate.cpp
# Opt level: O1

void __thiscall tcu::StringTemplate::StringTemplate(StringTemplate *this,string *str)

{
  (this->m_template)._M_dataplus._M_p = (pointer)&(this->m_template).field_2;
  (this->m_template)._M_string_length = 0;
  (this->m_template).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  return;
}

Assistant:

StringTemplate::StringTemplate (const std::string& str)
{
	setString(str);
}